

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall
chaiscript::eval::Inline_Range_AST_Node::~Inline_Range_AST_Node(Inline_Range_AST_Node *this)

{
  void *in_RDI;
  
  ~Inline_Range_AST_Node((Inline_Range_AST_Node *)0x24a298);
  operator_delete(in_RDI,0x90);
  return;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          try {
            auto oper1 = children[0]->children[0]->children[0]->eval(t_ss);
            auto oper2 = children[0]->children[0]->children[1]->eval(t_ss);
            return t_ss->call_function("generate_range", m_loc, {oper1, oper2}, t_ss.conversions());
          }
          catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Unable to generate range vector, while calling 'generate_range'", e.parameters, e.functions, false, *t_ss);
          }
        }